

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O0

void __thiscall
for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
::test_method(for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *this)

{
  allocator<unsigned_long> *this_00;
  value_type vVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  reference puVar5;
  reference pvVar6;
  lazy_ostream *plVar7;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2c0;
  assertion_result local_2a0;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_248;
  assertion_result local_228;
  basic_cstring<const_char> local_210;
  basic_cstring<const_char> local_200;
  ulong local_1f0;
  unsigned_long num_simplices_1;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num_simplices_by_dim;
  unsigned_long num_simplices;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  anon_class_8_1_65c67687 lambda_nb_simp_by_dim;
  undefined1 local_188 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> num_simplices_by_dim_until_two;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 *local_148;
  undefined8 local_140;
  undefined1 local_138 [40];
  size_t local_110;
  undefined1 local_108 [32];
  pointer local_e8;
  size_t local_e0;
  undefined1 local_c8 [40];
  pointer local_a0;
  undefined1 local_98 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> st;
  for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  *this_local;
  
  st._128_8_ = this;
  poVar4 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::clog,"TEST FOR_EACH ITERATION SKIP MECHANISM");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  local_c8._20_4_ = 2;
  local_c8._24_4_ = 1;
  local_c8._28_4_ = 0;
  local_c8._32_8_ = local_c8 + 0x14;
  local_a0 = (pointer)0x3;
  local_c8._16_4_ = 0x40400000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_c8,
             (initializer_list<int> *)local_98,(Filtration_value *)(local_c8 + 0x20));
  local_108._24_4_ = 3;
  local_108._28_4_ = 0;
  local_e8 = (pointer)((long)local_108 + 0x18);
  local_e0 = 2;
  local_108._20_4_ = 0x40000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)((long)local_138 + 0x30),
             (initializer_list<int> *)local_98,(Filtration_value *)&local_e8);
  local_138._20_4_ = 3;
  local_138._24_4_ = 4;
  local_138._28_4_ = 5;
  local_138._32_8_ = local_138 + 0x14;
  local_110 = 3;
  local_138._16_4_ = 0x40400000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_138,
             (initializer_list<int> *)local_98,(Filtration_value *)(local_138 + 0x20));
  local_158 = 0;
  local_154 = 1;
  local_150 = 6;
  local_14c = 7;
  local_148 = &local_158;
  local_140 = 4;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
             &num_simplices_by_dim_until_two.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(initializer_list<int> *)local_98,
             (Filtration_value *)&local_148);
  this_00 = (allocator<unsigned_long> *)
            ((long)&lambda_nb_simp_by_dim.num_simplices_by_dim_until_two + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,2,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&lambda_nb_simp_by_dim.num_simplices_by_dim_until_two + 7));
  __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  for_each_simplex<for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>::test_method()::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int)_1_&>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (anon_class_8_1_65c67687 *)&__range1);
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  num_simplices =
       (unsigned_long)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&num_simplices), bVar3) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*puVar5;
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        (ulong)num_simplices_by_dim.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,", ");
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices_by_dimension
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1,
             (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1);
  num_simplices_1 =
       (unsigned_long)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&num_simplices_1), bVar3) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    local_1f0 = *puVar5;
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_1f0);
    std::operator<<(poVar4,", ");
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_210);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_200,0x4cd,&local_210);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,0);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1,0);
    boost::test_tools::assertion_result::assertion_result(&local_228,vVar1 == *pvVar6);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,"num_simplices_by_dim_until_two[0] == num_simplices_by_dim[0]",0x3c);
    boost::unit_test::operator<<(&local_248,plVar7,&local_258);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_228,&local_248,&local_268,0x4cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_248);
    boost::test_tools::assertion_result::~assertion_result(&local_228);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_288);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_278,0x4ce,&local_288);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,1);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1,1);
    boost::test_tools::assertion_result::assertion_result(&local_2a0,vVar1 == *pvVar6);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,"num_simplices_by_dim_until_two[1] == num_simplices_by_dim[1]",0x3c);
    boost::unit_test::operator<<(&local_2c0,plVar7,&local_2d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_2a0,&local_2c0,&local_2e0,0x4ce,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2c0);
    boost::test_tools::assertion_result::~assertion_result(&local_2a0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(for_each_simplex_skip_iteration, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST FOR_EACH ITERATION SKIP MECHANISM" << std::endl;
  typeST st;

  st.insert_simplex_and_subfaces({2, 1, 0}, 3.);
  st.insert_simplex_and_subfaces({3, 0}, 2.);
  st.insert_simplex_and_subfaces({3, 4, 5}, 3.);
  st.insert_simplex_and_subfaces({0, 1, 6, 7}, 4.);

  /* Inserted simplex:        */
  /*    1   6                 */
  /*    o---o                 */
  /*   /X\7/                  */
  /*  o---o---o---o           */
  /*  2   0   3\X/4           */
  /*            o             */
  /*            5             */

  std::vector<size_t> num_simplices_by_dim_until_two(2);
  auto lambda_nb_simp_by_dim = [&num_simplices_by_dim_until_two](typename typeST::Simplex_handle, int dim)
                                  {
                                    BOOST_CHECK (dim < 2);
                                    ++num_simplices_by_dim_until_two[dim];
                                    return dim >= 1; // The iteration will skip the children in this case
                                  };
  st.for_each_simplex(lambda_nb_simp_by_dim);
  for (auto num_simplices : num_simplices_by_dim_until_two)
    std::cout << num_simplices << ", ";
  std::cout << std::endl;

  auto num_simplices_by_dim = st.num_simplices_by_dimension();
  for (auto num_simplices : num_simplices_by_dim)
    std::cout << num_simplices << ", ";
  std::cout << std::endl;

  BOOST_CHECK(num_simplices_by_dim_until_two[0] == num_simplices_by_dim[0]);
  BOOST_CHECK(num_simplices_by_dim_until_two[1] == num_simplices_by_dim[1]);
}